

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall goodform::form::form(form *this,any *v)

{
  allocator<char> local_39;
  string local_38;
  any *local_18;
  any *v_local;
  form *this_local;
  
  local_18 = v;
  v_local = (any *)this;
  sub_form::sub_form(&this->super_sub_form,v,&this->error_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  error_message::error_message(&this->error_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

form::form(const any& v) : error_(""), sub_form(v, error_)
  {

  }